

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O3

void __thiscall MapWrapper::freeAllItems(MapWrapper *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  
  for (p_Var2 = (this->map)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    p_Var1 = p_Var2[5]._M_nxt;
    if (p_Var1 != (_Hash_node_base *)0x0) {
      if (p_Var1[6]._M_nxt != (_Hash_node_base *)0x0) {
        operator_delete__(p_Var1[6]._M_nxt);
      }
      if (p_Var1->_M_nxt != p_Var1 + 2) {
        operator_delete(p_Var1->_M_nxt);
      }
    }
    operator_delete(p_Var1);
  }
  return;
}

Assistant:

void freeAllItems() {
        for (auto& entry : map) {
            delete entry.second;
        }
    }